

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

string * __thiscall
Character::PaddedGuildTag_abi_cxx11_(string *__return_storage_ptr__,Character *this)

{
  World *pWVar1;
  bool bVar2;
  mapped_type *this_00;
  ulong uVar3;
  element_type *peVar4;
  int subject;
  ulong local_c0;
  size_t i;
  string local_b0 [32];
  undefined8 local_90;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  undefined8 local_80;
  string local_78;
  allocator<char> local_41;
  key_type local_40;
  undefined1 local_19;
  Character *local_18;
  Character *this_local;
  string *tag;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Character *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  pWVar1 = this->world;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"ShowLevel",&local_41);
  this_00 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
            ::operator[](&(pWVar1->config).
                          super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         ,&local_40);
  bVar2 = util::variant::operator_cast_to_bool(this_00);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  if (bVar2) {
    util::to_string_abi_cxx11_(&local_78,(util *)(ulong)this->level,subject);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    uVar3 = std::__cxx11::string::length();
    if (uVar3 < 3) {
      local_88._M_current = (char *)std::__cxx11::string::begin();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_80,&local_88);
      local_90 = std::__cxx11::string::insert(__return_storage_ptr__,local_80,0x4c);
    }
  }
  else {
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->guild);
    i._6_1_ = 0;
    if (bVar2) {
      peVar4 = std::__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &this->guild);
      std::__cxx11::string::string(local_b0,(string *)&peVar4->tag);
    }
    else {
      std::allocator<char>::allocator();
      i._6_1_ = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (local_b0,"",(allocator<char> *)((long)&i + 7));
    }
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_b0);
    std::__cxx11::string::~string(local_b0);
    if ((i._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
    }
  }
  for (local_c0 = std::__cxx11::string::length(); local_c0 < 3; local_c0 = local_c0 + 1) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Character::PaddedGuildTag()
{
	std::string tag;

	if (this->world->config["ShowLevel"])
	{
		tag = util::to_string(this->level);
		if (tag.length() < 3)
		{
			tag.insert(tag.begin(), 'L');
		}
	}
	else
	{
		tag = this->guild ? this->guild->tag : "";
	}

	for (std::size_t i = tag.length(); i < 3; ++i)
	{
		tag.push_back(' ');
	}

	return tag;
}